

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::getBlendStateSetName_abi_cxx11_
          (string *__return_storage_ptr__,pipeline *this,
          VkPipelineColorBlendAttachmentState *blendStates)

{
  VkPipelineColorBlendAttachmentState *extraout_RDX;
  VkPipelineColorBlendAttachmentState *extraout_RDX_00;
  VkPipelineColorBlendAttachmentState *extraout_RDX_01;
  VkPipelineColorBlendAttachmentState *blendState;
  string local_1b8;
  int local_194;
  ostringstream local_190 [4];
  int quadNdx;
  ostringstream name;
  VkPipelineColorBlendAttachmentState *blendStates_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  blendState = extraout_RDX;
  for (local_194 = 0; local_194 < 4; local_194 = local_194 + 1) {
    getBlendStateName_abi_cxx11_(&local_1b8,this + (long)local_194 * 0x20,blendState);
    std::operator<<((ostream *)local_190,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    blendState = extraout_RDX_00;
    if (local_194 < 3) {
      std::operator<<((ostream *)local_190,"-");
      blendState = extraout_RDX_01;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getBlendStateSetName (const VkPipelineColorBlendAttachmentState blendStates[BlendTest::QUAD_COUNT])
{
	std::ostringstream name;

	for (int quadNdx = 0; quadNdx < BlendTest::QUAD_COUNT; quadNdx++)
	{
		name << getBlendStateName(blendStates[quadNdx]);

		if (quadNdx < BlendTest::QUAD_COUNT - 1)
			name << "-";
	}

	return name.str();
}